

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O3

bool ast::Sections::address_is_free(Section *s)

{
  uint uVar1;
  _List_node_base *p_Var2;
  undefined8 *puVar3;
  
  puVar3 = &list_abi_cxx11_;
  while (puVar3 = (undefined8 *)*puVar3, puVar3 != &list_abi_cxx11_) {
    uVar1 = *(uint *)(puVar3[2] + 0x24);
    if (s->content_size + s->base_address <= uVar1) break;
    if (s->base_address < uVar1 + *(int *)(puVar3[2] + 0x30)) {
      return false;
    }
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)s;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  _DAT_0013dab8 = _DAT_0013dab8 + 1;
  return true;
}

Assistant:

bool Sections::address_is_free(Section *s)
{
	auto iter = list.begin();
	for (; iter != list.end(); ++iter) {
		Section *r = *iter;
		if (s->base_address + s->content_size > r->base_address
				&& r->base_address + r->content_size > s->base_address)
			return false;
		if (s->base_address + s->content_size <= r->base_address)
			break;
	}
	list.insert(iter, s);
	return true;
}